

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::SmallVectorBase<std::basic_string_view<char,std::char_traits<char>>>::
emplaceRealloc<std::basic_string_view<char,std::char_traits<char>>>
          (SmallVectorBase<std::basic_string_view<char,std::char_traits<char>>> *this,pointer pos,
          basic_string_view<char,_std::char_traits<char>_> *args)

{
  undefined8 *puVar1;
  ulong uVar2;
  long lVar3;
  size_t *psVar4;
  char *pcVar5;
  undefined8 uVar6;
  size_t *psVar7;
  pointer pbVar8;
  long lVar9;
  long lVar10;
  ulong capacity;
  
  if (*(long *)(this + 8) == 0x7fffffffffffffff) {
    detail::throwLengthError();
  }
  capacity = *(long *)(this + 8) + 1;
  uVar2 = *(ulong *)(this + 0x10);
  if (capacity < uVar2 * 2) {
    capacity = uVar2 * 2;
  }
  if (0x7fffffffffffffff - uVar2 < uVar2) {
    capacity = 0x7fffffffffffffff;
  }
  lVar10 = (long)pos - *(long *)this;
  psVar7 = (size_t *)detail::allocArray(capacity,0x10);
  pcVar5 = args->_M_str;
  *(size_t *)((long)psVar7 + lVar10) = args->_M_len;
  ((size_t *)((long)psVar7 + lVar10))[1] = (size_t)pcVar5;
  pbVar8 = *(pointer *)this;
  lVar3 = *(long *)(this + 8);
  psVar4 = psVar7;
  if (pbVar8 + lVar3 == pos) {
    if (lVar3 != 0) {
      lVar9 = 0;
      do {
        puVar1 = (undefined8 *)((long)&pbVar8->_M_len + lVar9);
        uVar6 = puVar1[1];
        *(undefined8 *)((long)psVar7 + lVar9) = *puVar1;
        ((undefined8 *)((long)psVar7 + lVar9))[1] = uVar6;
        lVar9 = lVar9 + 0x10;
      } while (lVar3 * 0x10 != lVar9);
    }
  }
  else {
    for (; pbVar8 != pos; pbVar8 = pbVar8 + 1) {
      pcVar5 = pbVar8->_M_str;
      *psVar4 = pbVar8->_M_len;
      psVar4[1] = (size_t)pcVar5;
      psVar4 = psVar4 + 2;
    }
    pbVar8 = (pointer)(*(long *)(this + 8) * 0x10 + *(long *)this);
    if (pbVar8 != pos) {
      psVar4 = (size_t *)((long)psVar7 + lVar10);
      do {
        pcVar5 = pos->_M_str;
        psVar4[2] = pos->_M_len;
        psVar4[3] = (size_t)pcVar5;
        pos = pos + 1;
        psVar4 = psVar4 + 2;
      } while (pos != pbVar8);
    }
  }
  if (*(SmallVectorBase<std::basic_string_view<char,std::char_traits<char>>> **)this != this + 0x18)
  {
    free(*(SmallVectorBase<std::basic_string_view<char,std::char_traits<char>>> **)this);
  }
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  *(ulong *)(this + 0x10) = capacity;
  *(size_t **)this = psVar7;
  return (pointer)((long)psVar7 + lVar10);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}